

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

bool __thiscall flatbuffers::cpp::CppGenerator::generate_bfbs_embed(CppGenerator *this)

{
  CodeWriter *this_00;
  uint uVar1;
  StructDef *name;
  Namespace *name_space;
  bool bVar2;
  char *__s;
  uint8_t *buffer;
  string *psVar3;
  allocator<char> local_44a;
  allocator<char> local_449;
  string local_448;
  string final_code;
  string file_path;
  string local_3e8;
  string binary_schema_hex_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &this->code_;
  CodeWriter::Clear(this_00);
  __s = BaseGenerator::FlatBuffersGeneratedWarning();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&final_code,__s,(allocator<char> *)&binary_schema_hex_text);
  std::operator+(&file_path,"// ",&final_code);
  std::operator+(&local_48,&file_path,"\n\n");
  CodeWriter::operator+=(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&file_path);
  std::__cxx11::string::~string((string *)&final_code);
  name = ((this->super_BaseGenerator).parser_)->root_struct_def_;
  if (name == (StructDef *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"// Binary schema not generated, no root struct found",
               (allocator<char> *)&file_path);
    CodeWriter::operator+=(this_00,&local_68);
    psVar3 = &local_68;
  }
  else {
    psVar3 = (this->super_BaseGenerator).file_name_;
    name_space = (name->super_Definition).defined_namespace;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&final_code,"bfbs",(allocator<char> *)&binary_schema_hex_text);
    GenIncludeGuard(&file_path,psVar3,name_space,&final_code);
    std::__cxx11::string::~string((string *)&final_code);
    std::operator+(&local_88,"#ifndef ",&file_path);
    CodeWriter::operator+=(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::operator+(&local_a8,"#define ",&file_path);
    CodeWriter::operator+=(this_00,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"",(allocator<char> *)&final_code);
    CodeWriter::operator+=(this_00,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    if ((((this->super_BaseGenerator).parser_)->opts).gen_nullable == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"#pragma clang system_header\n\n",
                 (allocator<char> *)&final_code);
      CodeWriter::operator+=(this_00,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"#include <cstddef>",(allocator<char> *)&final_code);
    CodeWriter::operator+=(this_00,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"#include <cstdint>",(allocator<char> *)&final_code);
    CodeWriter::operator+=(this_00,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    SetNameSpace(this,(name->super_Definition).defined_namespace);
    EscapeKeyword(&final_code,this,(string *)name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&binary_schema_hex_text,"STRUCT_NAME",(allocator<char> *)&local_448);
    CodeWriter::SetValue(this_00,&binary_schema_hex_text,&final_code);
    std::__cxx11::string::~string((string *)&binary_schema_hex_text);
    buffer = FlatBufferBuilderImpl<false>::GetBufferPointer
                       (&((this->super_BaseGenerator).parser_)->builder_);
    uVar1 = (((this->super_BaseGenerator).parser_)->builder_).buf_.size_;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"      ",&local_449);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"",&local_44a);
    BufferToHexText(&binary_schema_hex_text,buffer,(ulong)uVar1,0x69,&local_448,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"struct {{STRUCT_NAME}}BinarySchema {",
               (allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"  static const uint8_t *data() {",(allocator<char> *)&local_448
              );
    CodeWriter::operator+=(this_00,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"    // Buffer containing the binary schema.",
               (allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    NumToString<unsigned_int>
              (&local_3e8,(((this->super_BaseGenerator).parser_)->builder_).buf_.size_);
    std::operator+(&local_448,"    static const uint8_t bfbsData[",&local_3e8);
    std::operator+(&local_1a8,&local_448,"] = {");
    CodeWriter::operator+=(this_00,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::string((string *)&local_1c8,(string *)&binary_schema_hex_text);
    CodeWriter::operator+=(this_00,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"    };",(allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"    return bfbsData;",(allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"  }",(allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"  static size_t size() {",(allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    NumToString<unsigned_int>
              (&local_3e8,(((this->super_BaseGenerator).parser_)->builder_).buf_.size_);
    std::operator+(&local_448,"    return ",&local_3e8);
    std::operator+(&local_268,&local_448,";");
    CodeWriter::operator+=(this_00,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"  }",(allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"  const uint8_t *begin() {",(allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,"    return data();",(allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"  }",(allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"  const uint8_t *end() {",(allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"    return data() + size();",(allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"  }",(allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"};",(allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_388,"",(allocator<char> *)&local_448);
    CodeWriter::operator+=(this_00,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    if (this->cur_name_space_ != (Namespace *)0x0) {
      SetNameSpace(this,(Namespace *)0x0);
    }
    std::operator+(&local_3a8,"#endif  // ",&file_path);
    CodeWriter::operator+=(this_00,&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&binary_schema_hex_text);
    std::__cxx11::string::~string((string *)&final_code);
    psVar3 = &file_path;
  }
  std::__cxx11::string::~string((string *)psVar3);
  psVar3 = (this->super_BaseGenerator).path_;
  std::operator+(&final_code,(this->super_BaseGenerator).file_name_,"_bfbs");
  BaseGenerator::GeneratedFileName
            (&file_path,&this->super_BaseGenerator,psVar3,&final_code,
             &(this->opts_).super_IDLOptions);
  std::__cxx11::string::~string((string *)&final_code);
  std::__cxx11::stringbuf::str();
  bVar2 = SaveFile(file_path._M_dataplus._M_p,&final_code,false);
  std::__cxx11::string::~string((string *)&final_code);
  std::__cxx11::string::~string((string *)&file_path);
  return bVar2;
}

Assistant:

bool generate_bfbs_embed() {
    code_.Clear();
    code_ += "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n";

    // If we don't have a root struct definition,
    if (!parser_.root_struct_def_) {
      // put a comment in the output why there is no code generated.
      code_ += "// Binary schema not generated, no root struct found";
    } else {
      auto &struct_def = *parser_.root_struct_def_;
      const auto include_guard =
          GenIncludeGuard(file_name_, *struct_def.defined_namespace, "bfbs");

      code_ += "#ifndef " + include_guard;
      code_ += "#define " + include_guard;
      code_ += "";
      if (parser_.opts.gen_nullable) {
        code_ += "#pragma clang system_header\n\n";
      }

      code_ += "#include <cstddef>";
      code_ += "#include <cstdint>";

      SetNameSpace(struct_def.defined_namespace);
      auto name = Name(struct_def);
      code_.SetValue("STRUCT_NAME", name);

      // Create code to return the binary schema data.
      auto binary_schema_hex_text =
          BufferToHexText(parser_.builder_.GetBufferPointer(),
                          parser_.builder_.GetSize(), 105, "      ", "");

      code_ += "struct {{STRUCT_NAME}}BinarySchema {";
      code_ += "  static const uint8_t *data() {";
      code_ += "    // Buffer containing the binary schema.";
      code_ += "    static const uint8_t bfbsData[" +
               NumToString(parser_.builder_.GetSize()) + "] = {";
      code_ += binary_schema_hex_text;
      code_ += "    };";
      code_ += "    return bfbsData;";
      code_ += "  }";
      code_ += "  static size_t size() {";
      code_ += "    return " + NumToString(parser_.builder_.GetSize()) + ";";
      code_ += "  }";
      code_ += "  const uint8_t *begin() {";
      code_ += "    return data();";
      code_ += "  }";
      code_ += "  const uint8_t *end() {";
      code_ += "    return data() + size();";
      code_ += "  }";
      code_ += "};";
      code_ += "";

      if (cur_name_space_) SetNameSpace(nullptr);

      // Close the include guard.
      code_ += "#endif  // " + include_guard;
    }

    // We are just adding "_bfbs" to the generated filename.
    const auto file_path =
        GeneratedFileName(path_, file_name_ + "_bfbs", opts_);
    const auto final_code = code_.ToString();

    return SaveFile(file_path.c_str(), final_code, false);
  }